

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FSerializer *arc,SDWORD *vars,int max)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  SDWORD count;
  int32_t local_30;
  int local_2c;
  
  bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
  if (!bVar2) {
    return;
  }
  if (arc->w == (FWriter *)0x0) {
    memset(vars,0,(long)max << 2);
    ::Serialize(arc,"count",&local_30,(int32_t *)0x0);
    if (local_30 == 0) goto LAB_003b24b2;
    ::Serialize(arc,"first",&local_2c,(int32_t *)0x0);
    if (max < local_30 + local_2c) {
      local_30 = max - local_2c;
    }
  }
  else {
    if (max < 1) {
      uVar4 = 0;
    }
    else {
      uVar3 = 0;
      do {
        uVar4 = uVar3;
        if (vars[uVar3] != 0) break;
        uVar3 = uVar3 + 1;
        uVar4 = (ulong)(uint)max;
      } while ((uint)max != uVar3);
    }
    local_2c = (int)uVar4;
    lVar5 = (long)max;
    local_30 = (max - local_2c) + 1;
    do {
      if (lVar5 <= local_2c) {
        local_30 = 0;
        ::Serialize(arc,"count",&local_30,(int32_t *)0x0);
        goto LAB_003b24b2;
      }
      local_30 = local_30 + -1;
      lVar1 = lVar5 + -1;
      lVar5 = lVar5 + -1;
    } while (vars[lVar1] == 0);
    ::Serialize(arc,"count",&local_30,(int32_t *)0x0);
    ::Serialize(arc,"first",&local_2c,(int32_t *)0x0);
  }
  FSerializer::Array<int>(arc,"values",vars + local_2c,local_30,false);
LAB_003b24b2:
  FSerializer::EndObject(arc);
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FSerializer &arc, SDWORD *vars, int max)
{
	SDWORD count;
	SDWORD first, last;

	if (arc.BeginObject(nullptr))
	{
		if (arc.isWriting())
		{
			// Find first non-zero variable
			for (first = 0; first < max; ++first)
			{
				if (vars[first] != 0)
				{
					break;
				}
			}

			// Find last non-zero variable
			for (last = max - 1; last >= first; --last)
			{
				if (vars[last] != 0)
				{
					break;
				}
			}

			if (last < first)
			{ // no non-zero variables
				count = 0;
				arc("count", count);
			}
			else
			{
				count = last - first + 1;
				arc("count", count);
				arc("first", first);
				arc.Array("values", &vars[first], count);
			}
		}
		else
		{
			memset(vars, 0, max * sizeof(*vars));
			arc("count", count);

			if (count != 0)
			{
				arc("first", first);
				if (first + count > max) count = max - first;
				arc.Array("values", &vars[first], count);
			}
		}
		arc.EndObject();
	}
}